

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall
HighsMipSolverData::setCallbackDataOut(HighsMipSolverData *this,double mipsolver_objective_value)

{
  pointer pHVar1;
  undefined1 *__nbytes;
  void *__buf;
  double *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 extraout_XMM0_Qa;
  double mip_rel_gap;
  double primal_bound;
  double dual_bound;
  double *in_stack_ffffffffffffffc8;
  double *in_stack_ffffffffffffffd8;
  HighsMipSolverData *in_stack_ffffffffffffffe0;
  undefined8 local_18;
  
  __nbytes = &stack0xffffffffffffffd8;
  limitsToBounds(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI,
                 in_stack_ffffffffffffffc8);
  HighsTimer::read((HighsTimer *)((long)*in_RDI + 0x168),0,__buf,(size_t)__nbytes);
  *(undefined8 *)(*(long *)*in_RDI + 0x60) = extraout_XMM0_Qa;
  *(undefined8 *)(*(long *)*in_RDI + 0x78) = in_XMM0_Qa;
  pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x62f363);
  *(int64_t *)(*(long *)*in_RDI + 0x80) = pHVar1->num_nodes;
  pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x62f38e);
  *(int64_t *)(*(long *)*in_RDI + 0x88) = pHVar1->total_lp_iterations;
  *(HighsMipSolverData **)(*(long *)*in_RDI + 0x90) = in_stack_ffffffffffffffe0;
  *(undefined8 *)(*(long *)*in_RDI + 0x98) = local_18;
  *(double **)(*(long *)*in_RDI + 0xa0) = in_stack_ffffffffffffffd8;
  return;
}

Assistant:

void HighsMipSolverData::setCallbackDataOut(
    const double mipsolver_objective_value) const {
  double dual_bound;
  double primal_bound;
  double mip_rel_gap;
  limitsToBounds(dual_bound, primal_bound, mip_rel_gap);
  mipsolver.callback_->data_out.running_time = mipsolver.timer_.read();
  mipsolver.callback_->data_out.objective_function_value =
      mipsolver_objective_value;
  mipsolver.callback_->data_out.mip_node_count = mipsolver.mipdata_->num_nodes;
  mipsolver.callback_->data_out.mip_total_lp_iterations =
      mipsolver.mipdata_->total_lp_iterations;
  mipsolver.callback_->data_out.mip_primal_bound = primal_bound;
  mipsolver.callback_->data_out.mip_dual_bound = dual_bound;
  mipsolver.callback_->data_out.mip_gap = mip_rel_gap;
}